

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  undefined8 uVar1;
  size_type sVar2;
  size_type sVar3;
  undefined8 uVar4;
  size_type sVar5;
  string *in_RDX;
  undefined8 *in_RSI;
  AssertionResultData *in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionInfo *info_00;
  RunContext *this_00;
  LazyExpression *in_stack_fffffffffffffee0;
  OfType in_stack_fffffffffffffeec;
  AssertionResultData *in_stack_fffffffffffffef0;
  undefined1 local_88 [80];
  AssertionResult *in_stack_ffffffffffffffc8;
  RunContext *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)&in_RDI[4].reconstructedExpression.field_2 = *(undefined4 *)(in_RSI + 6);
  uVar1 = *in_RSI;
  sVar2 = in_RSI[1];
  sVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  sVar5 = in_RSI[5];
  *(undefined8 *)&in_RDI[4].reconstructedExpression = in_RSI[4];
  in_RDI[4].reconstructedExpression._M_string_length = sVar5;
  in_RDI[4].message.field_2._M_allocated_capacity = sVar3;
  *(undefined8 *)((long)&in_RDI[4].message.field_2 + 8) = uVar4;
  *(undefined8 *)&in_RDI[4].message = uVar1;
  in_RDI[4].message._M_string_length = sVar2;
  info_00 = (AssertionInfo *)local_88;
  LazyExpression::LazyExpression((LazyExpression *)info_00,false);
  this_00 = (RunContext *)(local_88 + 0x10);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  std::__cxx11::string::operator=((string *)this_00,in_RDX);
  AssertionResult::AssertionResult((AssertionResult *)this_00,info_00,in_RDI);
  assertionEnded(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  populateReaction(this_00,(AssertionReaction *)info_00);
  AssertionResult::~AssertionResult((AssertionResult *)0x12b094);
  AssertionResultData::~AssertionResultData(in_RDI);
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string const& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = message;
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
        populateReaction( reaction );
    }